

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codewriter_p.h
# Opt level: O3

void __thiscall asmjit::v1_14::CodeWriter::remove8(CodeWriter *this,uint8_t *where)

{
  uint8_t *puVar1;
  int extraout_EDX;
  uint8_t *puVar2;
  
  puVar1 = this->_cursor;
  if (where < puVar1) {
    for (puVar2 = where + 1; puVar2 != puVar1; puVar2 = puVar2 + 1) {
      puVar2[-1] = *puVar2;
      puVar1 = this->_cursor;
    }
    this->_cursor = puVar1 + -1;
    return;
  }
  remove8();
  if (extraout_EDX != 0) {
    if ((extraout_EDX != 1) && (extraout_EDX != 4)) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/x86/x86assembler.cpp"
                 ,0x187,"immSize == 1 || immSize == 4");
    }
    *this->_cursor = (uint8_t)where;
    puVar1 = this->_cursor;
    this->_cursor = puVar1 + 1;
    if ((char)extraout_EDX != '\x01') {
      puVar1[1] = (uint8_t)((ulong)where >> 8);
      puVar1 = this->_cursor;
      this->_cursor = puVar1 + 1;
      puVar1[1] = (uint8_t)((ulong)where >> 0x10);
      puVar1 = this->_cursor;
      this->_cursor = puVar1 + 1;
      puVar1[1] = (uint8_t)((ulong)where >> 0x18);
      this->_cursor = this->_cursor + 1;
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void remove8(uint8_t* where) noexcept {
    ASMJIT_ASSERT(where < _cursor);

    uint8_t* p = where;
    while (++p != _cursor)
      p[-1] = p[0];
    _cursor--;
  }